

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O0

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  int i;
  float bias;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  int local_94;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  Mat local_80;
  float *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = *(int *)(in_RSI + 0x38);
  local_2c = local_1c * local_20 * local_24;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    Mat::channel(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    pfVar2 = Mat::operator_cast_to_float_(&local_80);
    Mat::~Mat((Mat *)0x1a09aa);
    local_38 = pfVar2;
    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)local_30);
    fVar1 = *pfVar2;
    for (local_94 = 0; local_94 < local_2c; local_94 = local_94 + 1) {
      local_38[local_94] = fVar1 + local_38[local_94];
    }
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i = 0; i < size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}